

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall CommandDrawBar::Parse(CommandDrawBar *this,FScanner *sc,bool fullScreenOffsets)

{
  char cVar1;
  uint uVar2;
  SBarInfo *pSVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  PClassActor *pPVar7;
  ClassReg *pCVar8;
  int *piVar9;
  int *piVar10;
  
  FScanner::MustGetToken(sc,0x102);
  iVar6 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->foreground = iVar6;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar6 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->background = iVar6;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar4 = FScanner::Compare(sc,"health");
  if (bVar4) {
    this->type = HEALTH;
  }
  else {
    bVar4 = FScanner::Compare(sc,"armor");
    if (!bVar4) {
      bVar4 = FScanner::Compare(sc,"ammo1");
      if (bVar4) {
        this->type = AMMO1;
        goto LAB_005fe8cf;
      }
      bVar4 = FScanner::Compare(sc,"ammo2");
      if (bVar4) {
        this->type = AMMO2;
        goto LAB_005fe8cf;
      }
      bVar4 = FScanner::Compare(sc,"ammo");
      if (bVar4) {
        bVar4 = FScanner::CheckToken(sc,0x28);
        if ((!bVar4) || (bVar5 = FScanner::CheckToken(sc,0x102), !bVar5)) {
          FScanner::MustGetToken(sc,0x101);
        }
        this->type = AMMO;
        pPVar7 = PClass::FindActor(sc->String);
        (this->data).field_1.inventoryItem = pPVar7;
        if (pPVar7 == (PClassActor *)0x0) {
LAB_005feb5e:
          FScanner::ScriptMessage(sc,"\'%s\' is not a type of ammo.",sc->String);
          pCVar8 = &AAmmo::RegistrationInfo;
          goto LAB_005feb79;
        }
        if (pPVar7 != (PClassActor *)AAmmo::RegistrationInfo.MyClass) {
          do {
            pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
            if (pPVar7 == (PClassActor *)AAmmo::RegistrationInfo.MyClass) break;
          } while (pPVar7 != (PClassActor *)0x0);
          if (pPVar7 == (PClassActor *)0x0) goto LAB_005feb5e;
        }
      }
      else {
        bVar4 = FScanner::Compare(sc,"frags");
        if (bVar4) {
          this->type = FRAGS;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"kills");
        if (bVar4) {
          this->type = KILLS;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"items");
        if (bVar4) {
          this->type = ITEMS;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"secrets");
        if (bVar4) {
          this->type = SECRETS;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"airtime");
        if (bVar4) {
          this->type = AIRTIME;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"savepercent");
        if (bVar4) {
          this->type = SAVEPERCENT;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::Compare(sc,"poweruptime");
        if (!bVar4) {
          this->type = INVENTORY;
          pPVar7 = PClass::FindActor(sc->String);
          (this->data).field_1.inventoryItem = pPVar7;
          if (pPVar7 != (PClassActor *)0x0) {
            if (pPVar7 == (PClassActor *)AInventory::RegistrationInfo.MyClass) goto LAB_005fe8cf;
            do {
              pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
              if (pPVar7 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
            } while (pPVar7 != (PClassActor *)0x0);
            if (pPVar7 != (PClassActor *)0x0) goto LAB_005fe8cf;
          }
          FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
          (this->data).field_1.inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
          goto LAB_005fe8cf;
        }
        bVar4 = FScanner::CheckToken(sc,0x28);
        this->type = POWERUPTIME;
        if ((!bVar4) || (bVar5 = FScanner::CheckToken(sc,0x102), !bVar5)) {
          FScanner::MustGetToken(sc,0x101);
        }
        pPVar7 = PClass::FindActor(sc->String);
        (this->data).field_1.inventoryItem = pPVar7;
        if (pPVar7 != (PClassActor *)0x0) {
          if (pPVar7 != (PClassActor *)APowerupGiver::RegistrationInfo.MyClass) {
            do {
              pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
              if (pPVar7 == (PClassActor *)APowerupGiver::RegistrationInfo.MyClass) break;
            } while (pPVar7 != (PClassActor *)0x0);
            if (pPVar7 == (PClassActor *)0x0) goto LAB_005fece3;
          }
          goto LAB_005feb80;
        }
LAB_005fece3:
        FScanner::ScriptMessage(sc,"\'%s\' is not a type of PowerupGiver.",sc->String);
        pCVar8 = &APowerupGiver::RegistrationInfo;
LAB_005feb79:
        (this->data).field_1 = *(anon_union_8_2_d4833da3_for_AdditionalData_1 *)pCVar8;
      }
LAB_005feb80:
      if (bVar4 != false) {
        FScanner::MustGetToken(sc,0x29);
      }
      goto LAB_005fe8cf;
    }
    this->type = ARMOR;
  }
  ParseComparator(this,sc);
LAB_005fe8cf:
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar4 = FScanner::Compare(sc,"horizontal");
  if (bVar4) {
    this->horizontal = true;
  }
  else {
    bVar4 = FScanner::Compare(sc,"vertical");
    if (!bVar4) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  bVar4 = FScanner::CheckToken(sc,0x101);
  if (bVar4) {
    do {
      bVar4 = FScanner::Compare(sc,"reverse");
      if (bVar4) {
        this->reverse = true;
      }
      else {
        bVar4 = FScanner::Compare(sc,"interpolate");
        if (bVar4) {
          FScanner::MustGetToken(sc,0x28);
          FScanner::MustGetToken(sc,0x104);
          this->interpolationSpeed = sc->Number;
          FScanner::MustGetToken(sc,0x29);
        }
        else {
          FScanner::ScriptError(sc,"Unkown flag \'%s\'.",sc->String);
        }
      }
      bVar4 = FScanner::CheckToken(sc,0x7c);
      if (!bVar4) {
        FScanner::MustGetToken(sc,0x2c);
      }
      bVar4 = FScanner::CheckToken(sc,0x101);
    } while (bVar4);
  }
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  bVar4 = FScanner::CheckToken(sc,0x2c);
  if (bVar4) {
    FScanner::MustGetToken(sc,0x104);
    uVar2 = sc->Number;
    this->border = uVar2;
    if (uVar2 != 0) {
      this->reverse = (bool)(this->reverse ^ 1);
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  if (this->type == ARMOR) {
    pSVar3 = (this->super_SBarInfoCommand).script;
    piVar9 = &pSVar3->armorInterpolationSpeed;
    cVar1 = pSVar3->interpolateArmor;
  }
  else {
    if (this->type != HEALTH) {
      return;
    }
    pSVar3 = (this->super_SBarInfoCommand).script;
    piVar9 = &pSVar3->interpolationSpeed;
    cVar1 = pSVar3->interpolateHealth;
  }
  piVar10 = &this->interpolationSpeed;
  if (cVar1 != '\0') {
    piVar10 = piVar9;
  }
  this->interpolationSpeed = *piVar10;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_StringConst);
			foreground = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst);
			background = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("health"))
			{
				type = HEALTH;
				ParseComparator(sc);
			}
			else if(sc.Compare("armor"))
			{
				type = ARMOR;
				ParseComparator(sc);
			}
			else if(sc.Compare("ammo1"))
				type = AMMO1;
			else if(sc.Compare("ammo2"))
				type = AMMO2;
			else if(sc.Compare("ammo")) //request the next string to be an ammo type
			{
				bool parenthesized = sc.CheckToken('(');

				if(!parenthesized || !sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				type = AMMO;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(data.inventoryItem)) //must be a kind of ammo
				{
					sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AAmmo);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else if(sc.Compare("frags"))
				type = FRAGS;
			else if(sc.Compare("kills"))
				type = KILLS;
			else if(sc.Compare("items"))
				type = ITEMS;
			else if(sc.Compare("secrets"))
				type = SECRETS;
			else if(sc.Compare("airtime"))
				type = AIRTIME;
			else if(sc.Compare("savepercent"))
				type = SAVEPERCENT;
			else if(sc.Compare("poweruptime"))
			{
				bool parenthesized = sc.CheckToken('(');

				type = POWERUPTIME;
				if(!parenthesized || !sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(APowerupGiver);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else
			{
				type = INVENTORY;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("horizontal"))
				horizontal = true;
			else if(!sc.Compare("vertical"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("reverse"))
					reverse = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unkown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, x, y);
			if(sc.CheckToken(',')) //border
			{
				sc.MustGetToken(TK_IntConst);
				border = sc.Number;

				// Flip the direction since it represents the area to clip
				if(border != 0)
					reverse = !reverse;
			}
			sc.MustGetToken(';');
		
			if(type == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(type == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}